

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots2
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  long index;
  double dVar1;
  long lVar2;
  undefined1 auVar3 [16];
  DenseStorage<double,__1,__1,_1,_0> *other;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  long index_00;
  Scalar SVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double yeps;
  double xeps;
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double local_b8;
  double local_b0;
  VectorXd yy;
  VectorXd xscaled;
  anon_class_64_1_54a39805 secant;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  other = (DenseStorage<double,__1,__1,_1,_0> *)get_CLnodes(lVar2 * 2 - 2);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&xscaled,other);
  y_Clenshaw_xscaled((ChebyshevExpansion *)&yy,&this->m_c);
  local_b0 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::maxCoeff<0>
                       ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&yy);
  SVar10 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::minCoeff<0>
                     ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&yy);
  local_b0 = (local_b0 - SVar10) * 1e-14;
  index_00 = 1;
  do {
    index = index_00 + 1;
    if (lVar2 * 2 + -1 <= index) {
      free(yy.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(xscaled.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      return __return_storage_ptr__;
    }
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xscaled,
                        index_00 + -1);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&yy,
                        index_00 + -1);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xscaled,
                        index_00);
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&yy,index_00);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&xscaled,index
                       );
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&yy,index);
    dVar11 = *pSVar4;
    dVar12 = *pSVar5;
    if (local_b0 <= ABS(dVar12)) {
      yeps = *pSVar8;
      dVar13 = *pSVar6;
      dVar18 = yeps - dVar13;
      dVar16 = dVar13 - dVar11;
      dVar17 = yeps - dVar11;
      auVar21._0_8_ = dVar18 * dVar16 * dVar17;
      dVar1 = *pSVar7;
      dVar19 = *pSVar9;
      xeps = dVar1 * -dVar17 * dVar11 * yeps;
      dVar17 = (dVar16 * dVar19 + (dVar18 * dVar12 - dVar1 * dVar17)) / auVar21._0_8_;
      auVar20._0_8_ = dVar19 * dVar16 * dVar13 * dVar11 + dVar12 * dVar13 * dVar18 * yeps + xeps;
      auVar20._8_8_ =
           dVar19 * -(dVar13 * dVar13 - dVar11 * dVar11) +
           dVar12 * -(yeps * yeps - dVar13 * dVar13) + dVar1 * (yeps * yeps - dVar11 * dVar11);
      auVar21._8_8_ = auVar21._0_8_;
      auVar21 = divpd(auVar20,auVar21);
      dVar12 = auVar21._0_8_;
      dVar13 = auVar21._8_8_;
      dVar11 = dVar13 * dVar13 + dVar17 * -4.0 * dVar12;
      if (0.0 <= dVar11) {
        if ((dVar17 != 0.0) || (NAN(dVar17))) {
          if ((dVar11 == 0.0) && (!NAN(dVar11))) {
            dVar11 = -dVar13 / (dVar17 + dVar17);
            goto LAB_0012b19a;
          }
          if (dVar11 < 0.0) {
            dVar11 = sqrt(dVar11);
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          if (0.0 <= dVar13) {
            auVar15._0_8_ = -dVar13 - dVar11;
            auVar15._8_8_ = dVar12 + dVar12;
            auVar3._8_8_ = auVar15._0_8_;
            auVar3._0_8_ = dVar17 + dVar17;
            auVar23 = divpd(auVar15,auVar3);
          }
          else {
            auVar22._0_8_ = dVar12 + dVar12;
            auVar22._8_8_ = dVar11 - dVar13;
            auVar14._8_8_ = dVar17 + dVar17;
            auVar14._0_8_ = dVar11 - dVar13;
            auVar23 = divpd(auVar22,auVar14);
          }
        }
        else {
          dVar11 = -dVar12 / dVar13;
LAB_0012b19a:
          auVar23._8_8_ = 0xc08f400000000000;
          auVar23._0_8_ = dVar11;
        }
        dVar11 = *pSVar4;
        dVar12 = *pSVar8;
        dVar1 = dVar12;
        if (dVar11 <= dVar12) {
          dVar1 = dVar11;
        }
        dVar19 = auVar23._0_8_;
        if (dVar12 <= dVar11) {
          dVar12 = dVar11;
        }
        dVar11 = auVar23._8_8_;
        ChebyshevExpansion(&secant.e,this);
        if ((dVar1 < dVar19 && dVar19 < dVar12) && (dVar1 < dVar11 && dVar11 < dVar12)) {
          dVar11 = -dVar13 / (dVar17 + dVar17);
          dVar12 = y_Clenshaw_xscaled(this,dVar11);
          dVar13 = real_roots2::anon_class_64_1_54a39805::operator()
                             (&secant,*pSVar4,*pSVar5,dVar11,dVar12,yeps,xeps);
          dVar11 = real_roots2::anon_class_64_1_54a39805::operator()
                             (&secant,dVar11,dVar12,*pSVar8,*pSVar9,yeps,xeps);
          local_b8 = ((this->m_xmax - this->m_xmin) * dVar13 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_b8);
          local_b8 = ((this->m_xmax - this->m_xmin) * dVar11 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_b8);
        }
        else if ((dVar1 < dVar19 && dVar19 < dVar12) != (dVar1 < dVar11 && dVar11 < dVar12)) {
          dVar11 = real_roots2::anon_class_64_1_54a39805::operator()
                             (&secant,*pSVar4,*pSVar5,*pSVar8,*pSVar9,yeps,xeps);
          local_b8 = ((this->m_xmax - this->m_xmin) * dVar11 + this->m_xmax + this->m_xmin) * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_b8);
        }
        ~ChebyshevExpansion(&secant.e);
      }
    }
    else {
      secant.e.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)(((this->m_xmax - this->m_xmin) * dVar11 + this->m_xmax + this->m_xmin) * 0.5);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,(double *)&secant);
    }
    index_00 = index_00 + 2;
  } while( true );
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots2(bool only_in_domain) const {
        //vector of roots to be returned
        std::vector<double> roots;

        auto N = m_c.size()-1;
        auto Ndegree_scaled = N*2;
        Eigen::VectorXd xscaled = get_CLnodes(Ndegree_scaled), yy = y_Clenshaw_xscaled(xscaled);
        double ytol = 1e-14*(yy.maxCoeff()-yy.minCoeff());
        
        // a,b,c can also be obtained by solving the matrix system:
        // [x_k^2, x_k, 1] = [b_k] for k in 1,2,3
        for (auto i = 0; i+2 < Ndegree_scaled+1; i += 2){
            const double &x_1 = xscaled[i + 0], &y_1 = yy[i + 0],
                         &x_2 = xscaled[i + 1], &y_2 = yy[i + 1],
                         &x_3 = xscaled[i + 2], &y_3 = yy[i + 2];
            double d = (x_3 - x_2)*(x_2 - x_1)*(x_3 - x_1);
            double a = ((x_3 - x_2)*y_1 - (x_3 - x_1)*y_2 + (x_2 - x_1)*y_3) / d;
            double b = (-(POW2(x_3) - POW2(x_2))*y_1 + (POW2(x_3) - POW2(x_1))*y_2 - (POW2(x_2) - POW2(x_1))*y_3) / d;
            double c = ((x_3 - x_2)*x_2*x_3*y_1 - (x_3 - x_1)*x_1*x_3*y_2 + (x_2 - x_1)*x_2*x_1*y_3) / d;

            // Check if precisely at a nodal value
            if (std::abs(y_1) < ytol) {
                roots.push_back(((m_xmax - m_xmin) * x_1 + (m_xmax + m_xmin)) / 2.0);
                continue;
            }

            // Discriminant of quadratic
            double D = b*b - 4*a*c;
            if (D >= 0) {
                double root1, root2;
                if (a == 0){
                    // Linear
                    root1 = -c/b;
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else if (D == 0) { // Unlikely due to numerical precision
                    // Two equal real roots
                    root1 = -b/(2*a);
                    root2 = -1000; // Something outside the domain; we are in scaled coordinates so this will definitely get rejected
                }
                else {
                    // Numerically stable method for solving quadratic
                    // From https://people.csail.mit.edu/bkph/articles/Quadratics.pdf
                    double sqrtD = sqrt(D);
                    if (b >= 0){
                        root1 = (-b - sqrtD)/(2*a);
                        root2 = 2*c/(-b-sqrtD);
                    }
                    else {
                        root1 = 2*c/(-b+sqrtD);
                        root2 = (-b+sqrtD)/(2*a);
                    }
                }
                bool in1 = inbetween(x_1, x_3, root1), in2 = inbetween(x_1, x_3, root2);
                const ChebyshevExpansion &e = *this;
                auto secant = [e](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
                    auto c = b - yb*(b - a) / (yb - ya);
                    auto yc = e.y_Clenshaw_xscaled(c);
                    for (auto i = 0; i < 50; ++i){
                        if (yc*ya > 0) {
                            a=c; ya=yc;
                        }
                        else {
                            b=c; yb=yc;
                        }
                        if (std::abs(b - a) < xeps) { break; }
                        if (std::abs(yc) < yeps){ break; }
                        c = b - yb*(b - a) / (yb - ya);
                        yc = e.y_Clenshaw_xscaled(c);
                    }
                    return c;
                };
                int Nroots_inside = static_cast<int>(in1) + static_cast<int>(in2);
                if (Nroots_inside == 2) {
                    // Split the domain at the midline of the quadratic, polish each root against the underlying expansion
                    double x_m = -b/(2*a), y_m = e.y_Clenshaw_xscaled(x_m);
                    root1 = secant(x_1, y_1, x_m, y_m);
                    root2 = secant(x_m, y_m, x_3, y_3);
                    // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0); 
                    roots.push_back(((m_xmax - m_xmin)*root2 + (m_xmax + m_xmin)) / 2.0);
                }
                else if(Nroots_inside == 1) {
                    root1 = secant(x_1, y_1, x_3, y_3);
                    roots.push_back(((m_xmax - m_xmin)*root1 + (m_xmax + m_xmin)) / 2.0);
                }
                else {}
            }
        }
        return roots;
    }